

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O1

BtorSimBitVector * btorsim_bv_sext(BtorSimBitVector *bv,uint32_t len)

{
  uint uVar1;
  BtorSimBitVector *pBVar2;
  BtorSimBitVector *a;
  uint uVar3;
  BtorSimBitVector *tmp;
  
  uVar3 = bv->width - 1;
  uVar1 = (&bv[1].width)[~(uVar3 >> 5) + bv->len];
  pBVar2 = btorsim_bv_new(len);
  a = pBVar2;
  if ((uVar1 >> (uVar3 & 0x1f) & 1) != 0) {
    a = btorsim_bv_not(pBVar2);
    free(pBVar2);
  }
  pBVar2 = btorsim_bv_concat(a,bv);
  free(a);
  return pBVar2;
}

Assistant:

BtorSimBitVector *
btorsim_bv_sext (const BtorSimBitVector *bv, uint32_t len)
{
  assert (bv);
  assert (len > 0);

  uint32_t msb;
  BtorSimBitVector *res, *tmp;

  msb = btorsim_bv_get_bit (bv, bv->width - 1);
  tmp = msb ? btorsim_bv_ones (len) : btorsim_bv_zero (len);
  res = btorsim_bv_concat (tmp, bv);
  btorsim_bv_free (tmp);
  assert (rem_bits_zero_dbg (res));
  return res;
}